

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Accuracy::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  pointer pPVar2;
  uint uVar3;
  int iVar4;
  TextureCube *this_00;
  ulong uVar5;
  long extraout_RAX;
  long lVar6;
  long lVar7;
  ulong uVar8;
  deUint32 step;
  RGBA local_5c;
  ulong local_58;
  long local_50;
  long local_48;
  Vec4 local_40;
  
  this_00 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_00;
  uVar1 = this->m_size;
  if (uVar1 == 0) {
    uVar3 = 0x20;
  }
  else {
    uVar3 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = uVar3 ^ 0x1f;
  }
  uVar8 = 0;
  uVar5 = 0;
  if (0 < (int)(0x1f - uVar3)) {
    uVar5 = (ulong)(0x1f - uVar3);
  }
  lVar6 = uVar5 * 0x28 + 0x28;
  local_50 = lVar6;
  do {
    if (uVar1 != 0) {
      local_58 = uVar8 & 0xffffffff;
      local_48 = uVar8 * 3;
      lVar7 = 0;
      iVar4 = 0;
      do {
        if ((CubeFace)uVar8 < CUBEFACE_LAST) {
          iVar4 = (*(code *)(&DAT_01be5f6c + *(int *)(&DAT_01be5f6c + local_58 * 4)))();
          return iVar4;
        }
        tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar8,iVar4);
        pPVar2 = (&(this->m_texture->m_refTexture).m_access[0].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)[local_48];
        local_5c.m_value = 0xff000000;
        tcu::RGBA::toVec(&local_5c);
        tcu::clear((PixelBufferAccess *)((long)&pPVar2->super_ConstPixelBufferAccess + lVar7),
                   &local_40);
        iVar4 = iVar4 + 1;
        lVar7 = lVar7 + 0x28;
        lVar6 = extraout_RAX;
      } while (local_50 != lVar7);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 6);
  return (int)lVar6;
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	m_texture = new glu::TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}